

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall kj::Path::eval(Path *__return_storage_ptr__,Path *this,StringPtr pathText)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t extraout_RDX;
  size_t in_R8;
  String *p;
  String *params;
  long lVar4;
  StringPtr path;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr path_02;
  Vector<kj::String> newParts;
  StringPtr local_50;
  ArrayBuilder<kj::String> local_40;
  
  local_50.content.size_ = pathText.content.size_;
  local_50.content.ptr = pathText.content.ptr;
  local_40.ptr = (String *)0x450268;
  local_40.pos = (RemoveConst<kj::String> *)0x2;
  bVar1 = StringPtr::startsWith(&local_50,(StringPtr *)&local_40);
  if (bVar1) {
    path.content.size_ = extraout_RDX;
    path.content.ptr = (char *)local_50.content.size_;
    sVar2 = countParts((Path *)local_50.content.ptr,path);
    local_40.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(sVar2);
    local_40.endPtr = local_40.ptr + sVar2;
    local_40.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    path_01.content.size_ = in_R8;
    path_01.content.ptr = (char *)local_50.content.size_;
    local_40.pos = local_40.ptr;
    evalImpl(__return_storage_ptr__,(Path *)&local_40,(Vector<kj::String> *)local_50.content.ptr,
             path_01);
  }
  else {
    sVar2 = (this->parts).size_;
    path_00.content.size_ = extraout_RDX;
    path_00.content.ptr = (char *)local_50.content.size_;
    sVar3 = countParts((Path *)local_50.content.ptr,path_00);
    sVar3 = sVar3 + sVar2;
    local_40.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(sVar3);
    local_40.endPtr = local_40.ptr + sVar3;
    local_40.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    params = (this->parts).ptr;
    local_40.pos = local_40.ptr;
    for (lVar4 = (this->parts).size_ * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
      Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_40,params);
      params = params + 1;
    }
    path_02.content.size_ = in_R8;
    path_02.content.ptr = (char *)local_50.content.size_;
    evalImpl(__return_storage_ptr__,(Path *)&local_40,(Vector<kj::String> *)local_50.content.ptr,
             path_02);
  }
  ArrayBuilder<kj::String>::dispose(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Path Path::eval(StringPtr pathText) && {
  if (pathText.startsWith("/")) {
    // Optimization: avoid copying parts that will just be dropped.
    return evalImpl(Vector<String>(countParts(pathText)), pathText);
  } else {
    Vector<String> newParts(parts.size() + countParts(pathText));
    for (auto& p: parts) newParts.add(kj::mv(p));
    return evalImpl(kj::mv(newParts), pathText);
  }
}